

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

nh_msgtype_rules * parse_msgtype_rules(char *str)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char pattern [121];
  undefined8 local_c0;
  char local_b8 [136];
  
  if (str == (char *)0x0) {
    return (nh_msgtype_rules *)0x0;
  }
  if ((*str == '\0') || (pcVar1 = strchr(str,0x3b), pcVar1 == (char *)0x0)) {
    return (nh_msgtype_rules *)0x0;
  }
  lVar4 = 0;
  do {
    pcVar1 = strchr(pcVar1 + 1,0x3b);
    lVar4 = lVar4 + 1;
  } while (pcVar1 != (char *)0x0);
  mt_rules_static.num_rules = (int)lVar4;
  mt_rules_static.rules = mt_rules_array;
  pcVar1 = strdup(str);
  lVar5 = 0;
  local_c0 = pcVar1;
  do {
    pcVar2 = strchr(pcVar1,0x3b);
    if (pcVar2 == (char *)0x0) break;
    *pcVar2 = '\0';
    __isoc99_sscanf(pcVar1,"(\"%120[^|]|%u)",local_b8,
                    (mt_rules_static.rules)->pattern + lVar5 + 0x78);
    sVar3 = strlen(local_b8);
    local_b8[sVar3 - 1] = '\0';
    strcpy((mt_rules_static.rules)->pattern + lVar5,local_b8);
    pcVar1 = pcVar2 + 1;
    lVar5 = lVar5 + 0x7c;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  free(local_c0);
  return &mt_rules_static;
}

Assistant:

struct nh_msgtype_rules *parse_msgtype_rules(const char *str)
{
    struct nh_msgtype_rules *out;
    char *semi, *copy;
    const char *start;
    int i, rcount;

    if (!str || !*str)
	return NULL;

    /* Count number of rules based on number of semicolons. */
    rcount = 0;
    start = str;
    while ((semi = strchr(start, ';'))) {
	rcount++;
	start = semi + 1;
    }
    if (rcount == 0)
	return NULL;

    out = &mt_rules_static;
    out->num_rules = rcount;
    out->rules = mt_rules_array;

    /* Parse the rules. */
    copy = strdup(str);
    start = copy;
    for (i = 0; i < rcount && (semi = strchr(start, ';')); i++) {
	/* Big enough for the pattern, extra " and null terminator. */
	char pattern[121];

	*semi = '\0';
	sscanf(start, "(\"%120[^|]|%u)", pattern, &out->rules[i].action);
	/* Remove extra " at the end of the %[ match. */
	pattern[strlen(pattern) - 1] = '\0';
	strcpy(out->rules[i].pattern, pattern);

	start = semi + 1;
    }
    free(copy);

    return out;
}